

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_rule.c
# Opt level: O0

feed_db_status_t store_fare_rule_db(fare_rule_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char local_98 [8];
  char qr [112];
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  fare_rule_t *record_local;
  
  memcpy(local_98,
         "INSERT INTO fare_rules (fare_id, route_id, origin_id, destination_id, contains_id) values (?1, ?2, ?3, ?4, ?5);"
         ,0x70);
  sqlite3_prepare_v2(db->conn,local_98,-1,(sqlite3_stmt **)(qr + 0x68),(char **)0x0);
  sqlite3_bind_text((sqlite3_stmt *)qr._104_8_,1,record->fare_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text((sqlite3_stmt *)qr._104_8_,2,record->route_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text((sqlite3_stmt *)qr._104_8_,3,record->origin_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text((sqlite3_stmt *)qr._104_8_,4,record->destination_id,-1,
                    (_func_void_void_ptr *)0x0);
  sqlite3_bind_text((sqlite3_stmt *)qr._104_8_,5,record->contains_id,-1,(_func_void_void_ptr *)0x0);
  iVar1 = sqlite3_step((sqlite3_stmt *)qr._104_8_);
  db->rc = iVar1;
  bVar3 = db->rc == 0x65;
  if (bVar3) {
    sqlite3_finalize((sqlite3_stmt *)qr._104_8_);
  }
  else {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
    sqlite3_finalize((sqlite3_stmt *)qr._104_8_);
  }
  record_local._4_4_ = (feed_db_status_t)bVar3;
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_fare_rule_db(fare_rule_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO fare_rules ("
                    "fare_id, route_id, origin_id, destination_id, contains_id"
                ") values ("
                    "?1, ?2, ?3, ?4, ?5"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->fare_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->route_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 3, record->origin_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 4, record->destination_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 5, record->contains_id, -1, SQLITE_STATIC);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}